

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testUVProcessChain.cxx
# Opt level: O0

bool operator==(Status *actual,ExpectedStatus *expected)

{
  ExpectedStatus *expected_local;
  Status *actual_local;
  
  if ((expected->Finished & 1U) == 0) {
    actual_local._7_1_ = actual == (Status *)0x0;
  }
  else if (actual == (Status *)0x0) {
    actual_local._7_1_ = false;
  }
  else if (((expected->MatchExitStatus & 1U) == 0) ||
          ((expected->Status).ExitStatus == actual->ExitStatus)) {
    if (((expected->MatchTermSignal & 1U) == 0) ||
       ((expected->Status).TermSignal == actual->TermSignal)) {
      actual_local._7_1_ = true;
    }
    else {
      actual_local._7_1_ = false;
    }
  }
  else {
    actual_local._7_1_ = false;
  }
  return actual_local._7_1_;
}

Assistant:

bool operator==(const cmUVProcessChain::Status* actual,
                const ExpectedStatus& expected)
{
  if (!expected.Finished) {
    return !actual;
  } else if (!actual) {
    return false;
  }
  if (expected.MatchExitStatus &&
      expected.Status.ExitStatus != actual->ExitStatus) {
    return false;
  }
  if (expected.MatchTermSignal &&
      expected.Status.TermSignal != actual->TermSignal) {
    return false;
  }
  return true;
}